

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opencv_interop.hpp
# Opt level: O1

core * __thiscall eos::core::to_mat(core *this,Image4u *image)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  Pixel<unsigned_char,_4> *pPVar4;
  int y;
  long lVar5;
  int x;
  long lVar6;
  
  cv::Mat::Mat((Mat *)this,image->height_,image->width_,0x18);
  if (0 < image->width_) {
    lVar6 = 0;
    do {
      if (0 < image->height_) {
        lVar5 = 0;
        do {
          y = (int)lVar5;
          x = (int)lVar6;
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
          bVar1 = (pPVar4->data_)._M_elems[0];
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
          bVar2 = (pPVar4->data_)._M_elems[1];
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
          bVar3 = (pPVar4->data_)._M_elems[2];
          pPVar4 = Image<eos::core::Pixel<unsigned_char,_4>_>::operator()(image,y,x);
          *(uint *)(**(long **)(this + 0x48) * lVar5 + *(long *)(this + 0x10) + lVar6 * 4) =
               (uint)bVar2 * 0x100 + (uint)bVar1 | (uint)bVar3 << 0x10 |
               (uint)(pPVar4->data_)._M_elems[3] << 0x18;
          lVar5 = lVar5 + 1;
        } while (lVar5 < image->height_);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < image->width_);
  }
  return this;
}

Assistant:

inline cv::Mat to_mat(const Image4u& image)
{
    cv::Mat opencv_matrix(static_cast<int>(image.height()), static_cast<int>(image.width()), CV_8UC4);
    for (int c = 0; c < image.width(); ++c)
    { // size_t
        for (int r = 0; r < image.height(); ++r)
        {
            // auto vals = image(r, c);
            opencv_matrix.at<cv::Vec4b>(r, c) =
                cv::Vec4b(image(r, c)[0], image(r, c)[1], image(r, c)[2], image(r, c)[3]);
        }
    }
    return opencv_matrix;
}